

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::stopAubCapture(CLIntercept *this,cl_command_queue command_queue)

{
  double __x;
  allocator local_39;
  string local_38 [32];
  
  if (this->m_AubCaptureStarted == true) {
    std::mutex::lock(&this->m_Mutex);
    if (this->m_AubCaptureStarted == true) {
      if (command_queue != (cl_command_queue)0x0) {
        (*(this->m_Dispatch).clFinish)(command_queue);
      }
      OS::Services::StopAubCapture(&this->m_OS,(ulong)(this->m_Config).AubCaptureEndWait);
      __x = (double)std::__cxx11::string::string(local_38,"AubCapture stopped.\n",&local_39);
      log(this,__x);
      std::__cxx11::string::~string(local_38);
      this->m_AubCaptureStarted = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::stopAubCapture(
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == true )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_AubCaptureStarted == true )
        {
            if( command_queue )
            {
                dispatch().clFinish( command_queue );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                OS().StopAubCaptureKDC(
                    config().AubCaptureEndWait );
            }
            else
#endif
            {
                OS().StopAubCapture(
                    config().AubCaptureEndWait );
            }
            log( "AubCapture stopped.\n" );

            // No matter what, clar the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = false;
        }
    }
}